

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# formatter.cpp
# Opt level: O1

unique_ptr<booster::locale::impl_icu::formatter<char>,_std::default_delete<booster::locale::impl_icu::formatter<char>_>_>
 __thiscall
booster::locale::impl_icu::generate_formatter<char>
          (impl_icu *this,ios_base *ios,Locale *locale,string *encoding)

{
  pointer pcVar1;
  long *plVar2;
  bool bVar3;
  bool bVar4;
  string *psVar5;
  Locale *locale_00;
  uint uVar6;
  ios_info *this_00;
  uint64_t uVar7;
  icu_formatters_cache *this_01;
  SimpleDateFormat *fmt;
  uint64_t uVar8;
  number_format<char> *pnVar9;
  NumberFormat *pNVar10;
  TimeZone *pTVar11;
  date_format<char> *pdVar12;
  SimpleDateFormat *this_02;
  string_set *psVar13;
  EStyle EVar14;
  undefined4 uVar15;
  UnicodeString *pUVar16;
  icu_std_converter<char,_1> *ftime;
  _Alloc_hider _Var17;
  uint uVar18;
  EStyle EVar19;
  ulong uVar20;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar21;
  UErrorCode err;
  UnicodeString pattern;
  icu_std_converter<char,_1> cvt_;
  icu_std_converter<char,_1> cvt__1;
  _Head_base<0UL,_icu_70::DateFormat_*,_false> local_280;
  UErrorCode local_274;
  string *local_270;
  Locale *local_268;
  undefined1 local_260 [64];
  icu_std_converter<char,_1> local_220;
  string local_1f0;
  string local_1d0;
  string local_1b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_190;
  string local_170;
  string local_150;
  string local_130;
  string local_110;
  string local_f0;
  string local_d0;
  icu_std_converter<char,_1> local_b0;
  icu_std_converter<char,_1> local_70;
  
  *(undefined8 *)this = 0;
  this_00 = ios_info::get(ios);
  uVar7 = ios_info::display_flags(this_00);
  std::locale::locale((locale *)local_260,(locale *)(ios + 0xd0));
  this_01 = std::use_facet<booster::locale::impl_icu::icu_formatters_cache>((locale *)local_260);
  std::locale::~locale((locale *)local_260);
  if (uVar7 == 0) {
    return (unique_ptr<booster::locale::impl_icu::formatter<char>,_std::default_delete<booster::locale::impl_icu::formatter<char>_>_>
            )this;
  }
  local_274 = U_ZERO_ERROR;
  switch(uVar7) {
  case 1:
    uVar18 = *(uint *)(ios + 0x18) & 0x104;
    pNVar10 = icu_formatters_cache::number_format(this_01,(uint)(uVar18 == 0x100));
    (**(code **)(*(long *)pNVar10 + 0xe8))(pNVar10,*(undefined4 *)(ios + 8));
    if ((uVar18 == 0x100) || (uVar15 = 0, uVar18 == 4)) {
      uVar15 = *(undefined4 *)(ios + 8);
    }
    (**(code **)(*(long *)pNVar10 + 0xf0))(pNVar10,uVar15);
    pnVar9 = (number_format<char> *)operator_new(0x40);
    paVar21 = &local_d0.field_2;
    pcVar1 = (encoding->_M_dataplus)._M_p;
    local_d0._M_dataplus._M_p = (pointer)paVar21;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_d0,pcVar1,pcVar1 + encoding->_M_string_length);
    number_format<char>::number_format(pnVar9,pNVar10,&local_d0);
    *(number_format<char> **)this = pnVar9;
    _Var17._M_p = local_d0._M_dataplus._M_p;
    break;
  case 2:
    uVar7 = ios_info::currency_flags(this_00);
    pNVar10 = icu_formatters_cache::number_format
                        (this_01,fmt_curr_iso - ((uVar7 & 0xffffffffffffffbf) == 0));
    pnVar9 = (number_format<char> *)operator_new(0x40);
    paVar21 = &local_f0.field_2;
    pcVar1 = (encoding->_M_dataplus)._M_p;
    local_f0._M_dataplus._M_p = (pointer)paVar21;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_f0,pcVar1,pcVar1 + encoding->_M_string_length);
    number_format<char>::number_format(pnVar9,pNVar10,&local_f0);
    *(number_format<char> **)this = pnVar9;
    _Var17._M_p = local_f0._M_dataplus._M_p;
    break;
  case 3:
    pNVar10 = icu_formatters_cache::number_format(this_01,fmt_per);
    (**(code **)(*(long *)pNVar10 + 0xe8))(pNVar10,*(undefined4 *)(ios + 8));
    if (((*(uint *)(ios + 0x18) & 0x104) == 0x100) ||
       (uVar15 = 0, (*(uint *)(ios + 0x18) & 0x104) == 4)) {
      uVar15 = *(undefined4 *)(ios + 8);
    }
    (**(code **)(*(long *)pNVar10 + 0xf0))(pNVar10,uVar15);
    pnVar9 = (number_format<char> *)operator_new(0x40);
    paVar21 = &local_110.field_2;
    pcVar1 = (encoding->_M_dataplus)._M_p;
    local_110._M_dataplus._M_p = (pointer)paVar21;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_110,pcVar1,pcVar1 + encoding->_M_string_length);
    number_format<char>::number_format(pnVar9,pNVar10,&local_110);
    *(number_format<char> **)this = pnVar9;
    _Var17._M_p = local_110._M_dataplus._M_p;
    break;
  case 4:
  case 5:
  case 6:
  case 7:
    local_268 = locale;
    fmt = icu_formatters_cache::date_formatter(this_01);
    local_270 = encoding;
    if (fmt == (SimpleDateFormat *)0x0) {
      fmt = (SimpleDateFormat *)0x0;
      goto LAB_00183764;
    }
    uVar8 = ios_info::time_flags(this_00);
    uVar18 = ((uint)uVar8 << 0x19 | (uint)uVar8 >> 7) - 1;
    uVar20 = (ulong)uVar18;
    if (3 < uVar18) {
      uVar20 = 1;
    }
    uVar8 = ios_info::date_flags(this_00);
    uVar6 = ((uint)uVar8 << 0x16 | (uint)uVar8 >> 10) - 1;
    uVar18 = 1;
    if (uVar6 < 4) {
      uVar18 = uVar6;
    }
    local_260._0_8_ = std::__cxx11::moneypunct_byname<wchar_t,false>::moneypunct_byname;
    local_260._8_2_ = 2;
    switch(uVar7) {
    case 4:
      pUVar16 = (UnicodeString *)(&this_01->field_0x10 + (ulong)uVar18 * 0x40);
      break;
    case 5:
      pUVar16 = (UnicodeString *)(&this_01->field_0x110 + uVar20 * 0x40);
      break;
    case 6:
      pUVar16 = (UnicodeString *)(&this_01->field_0x210 + uVar20 * 0x40 + (ulong)uVar18 * 0x100);
      break;
    case 7:
      if (((0x1f < *(ushort *)&this_01->field_0x58) && (0x1f < *(ushort *)&this_01->field_0x158)) &&
         (0x1f < *(ushort *)&this_01->field_0x358)) {
        pcVar1 = (local_270->_M_dataplus)._M_p;
        local_170._M_dataplus._M_p = (pointer)&local_170.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_170,pcVar1,pcVar1 + local_270->_M_string_length);
        icu_std_converter<char,_1>::icu_std_converter(&local_220,&local_170,cvt_skip);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_170._M_dataplus._M_p != &local_170.field_2) {
          operator_delete(local_170._M_dataplus._M_p);
        }
        psVar13 = ios_info::date_time_pattern_set(this_00);
        ios_info::string_set::get<char>(&local_190,psVar13);
        icu_std_converter<char,_1>::icu
                  (&local_b0,(char_type *)&local_220,local_190._M_dataplus._M_p);
        strftime_to_icu((impl_icu *)&local_70,(UnicodeString *)&local_b0,local_268);
        icu_70::UnicodeString::operator=((UnicodeString *)local_260,(UnicodeString *)&local_70);
        icu_70::UnicodeString::~UnicodeString((UnicodeString *)&local_70);
        icu_70::UnicodeString::~UnicodeString((UnicodeString *)&local_b0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_190._M_dataplus._M_p != &local_190.field_2) {
          operator_delete(local_190._M_dataplus._M_p);
        }
        if (local_220.charset_._M_dataplus._M_p != (pointer)((long)&local_220 + 0x18U)) {
          operator_delete(local_220.charset_._M_dataplus._M_p);
        }
      }
    default:
      goto switchD_00183326_default;
    }
    icu_70::UnicodeString::operator=((UnicodeString *)local_260,pUVar16);
switchD_00183326_default:
    if ((ushort)local_260._8_2_ < 0x20) {
      fmt = (SimpleDateFormat *)0x0;
    }
    else {
      (**(code **)(*(long *)fmt + 0x100))(fmt,local_260);
    }
    icu_70::UnicodeString::~UnicodeString((UnicodeString *)local_260);
LAB_00183764:
    if (fmt == (SimpleDateFormat *)0x0) {
      uVar8 = ios_info::time_flags(this_00);
      uVar20 = uVar8 - 0x80 >> 7;
      EVar14 = SHORT - (int)uVar20;
      if (3 < (uVar8 << 0x39 | uVar20)) {
        EVar14 = DEFAULT;
      }
      uVar8 = ios_info::date_flags(this_00);
      locale_00 = local_268;
      uVar20 = uVar8 - 0x400 >> 10;
      EVar19 = DEFAULT;
      if ((uVar8 << 0x36 | uVar20) < 4) {
        EVar19 = SHORT - (int)uVar20;
      }
      if (uVar7 == 6) {
        this_02 = (SimpleDateFormat *)
                  icu_70::DateFormat::createDateTimeInstance(EVar19,EVar14,local_268);
      }
      else if (uVar7 == 5) {
        this_02 = (SimpleDateFormat *)icu_70::DateFormat::createTimeInstance(EVar14,local_268);
      }
      else if (uVar7 == 4) {
        this_02 = (SimpleDateFormat *)icu_70::DateFormat::createDateInstance(EVar19,local_268);
      }
      else {
        pcVar1 = (local_270->_M_dataplus)._M_p;
        local_1b0._M_dataplus._M_p = (pointer)&local_1b0.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_1b0,pcVar1,pcVar1 + local_270->_M_string_length);
        icu_std_converter<char,_1>::icu_std_converter(&local_b0,&local_1b0,cvt_skip);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
          operator_delete(local_1b0._M_dataplus._M_p);
        }
        psVar13 = ios_info::date_time_pattern_set(this_00);
        ios_info::string_set::get<char>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_220,
                   psVar13);
        icu_std_converter<char,_1>::icu
                  (&local_70,(char_type *)&local_b0,(char_type *)local_220._0_8_);
        ftime = &local_70;
        strftime_to_icu((impl_icu *)local_260,(UnicodeString *)ftime,locale_00);
        icu_70::UnicodeString::~UnicodeString((UnicodeString *)&local_70);
        this_02 = (SimpleDateFormat *)icu_70::UMemory::operator_new((UMemory *)0x360,(ulong)ftime);
        if (this_02 == (SimpleDateFormat *)0x0) {
          this_02 = (SimpleDateFormat *)0x0;
        }
        else {
          icu_70::SimpleDateFormat::SimpleDateFormat
                    (this_02,(UnicodeString *)local_260,locale_00,&local_274);
        }
        icu_70::UnicodeString::~UnicodeString((UnicodeString *)local_260);
        if ((char_type *)local_220._0_8_ != (char_type *)((long)&local_220 + 0x10U)) {
          operator_delete((void *)local_220._0_8_);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b0.charset_._M_dataplus._M_p != &local_b0.charset_.field_2) {
          operator_delete(local_b0.charset_._M_dataplus._M_p);
        }
      }
      bVar4 = false;
      bVar3 = U_ZERO_ERROR < local_274;
      fmt = this_02;
      if (U_ZERO_ERROR < local_274) goto LAB_0018396e;
    }
    else {
      this_02 = (SimpleDateFormat *)0x0;
      bVar3 = false;
    }
    ios_info::time_zone_abi_cxx11_((string *)local_260,this_00);
    pTVar11 = get_time_zone((string *)local_260);
    psVar5 = local_270;
    (**(code **)(*(long *)fmt + 0xb8))(fmt,pTVar11);
    if ((_Impl *)local_260._0_8_ != (_Impl *)(local_260 + 0x10)) {
      operator_delete((void *)local_260._0_8_);
    }
    if (this_02 == (SimpleDateFormat *)0x0) {
      pdVar12 = (date_format<char> *)operator_new(0x48);
      pcVar1 = (psVar5->_M_dataplus)._M_p;
      local_1f0._M_dataplus._M_p = (pointer)&local_1f0.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_1f0,pcVar1,pcVar1 + psVar5->_M_string_length);
      date_format<char>::date_format(pdVar12,(DateFormat *)fmt,&local_1f0);
      plVar2 = *(long **)this;
      *(date_format<char> **)this = pdVar12;
      if (plVar2 != (long *)0x0) {
        (**(code **)(*plVar2 + 8))();
      }
      bVar4 = true;
      this_02 = (SimpleDateFormat *)0x0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
        operator_delete(local_1f0._M_dataplus._M_p);
      }
    }
    else {
      pdVar12 = (date_format<char> *)operator_new(0x48);
      pcVar1 = (psVar5->_M_dataplus)._M_p;
      local_280._M_head_impl = (DateFormat *)this_02;
      local_1d0._M_dataplus._M_p = (pointer)&local_1d0.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_1d0,pcVar1,pcVar1 + psVar5->_M_string_length);
      date_format<char>::date_format
                (pdVar12,(unique_ptr<icu_70::DateFormat,_std::default_delete<icu_70::DateFormat>_> *
                         )&local_280,&local_1d0);
      plVar2 = *(long **)this;
      *(date_format<char> **)this = pdVar12;
      if (plVar2 != (long *)0x0) {
        (**(code **)(*plVar2 + 8))();
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
        operator_delete(local_1d0._M_dataplus._M_p);
      }
      if (local_280._M_head_impl != (DateFormat *)0x0) {
        (**(code **)(*(long *)local_280._M_head_impl + 8))();
      }
      local_280._M_head_impl = (DateFormat *)0x0;
      bVar4 = true;
      this_02 = (SimpleDateFormat *)0x0;
    }
LAB_0018396e:
    if (this_02 != (SimpleDateFormat *)0x0) {
      (**(code **)(*(long *)this_02 + 8))(this_02);
    }
    if (bVar4) {
      return (unique_ptr<booster::locale::impl_icu::formatter<char>,_std::default_delete<booster::locale::impl_icu::formatter<char>_>_>
              )this;
    }
    if (bVar3) {
      return (unique_ptr<booster::locale::impl_icu::formatter<char>,_std::default_delete<booster::locale::impl_icu::formatter<char>_>_>
              )this;
    }
    if (*(long **)this != (long *)0x0) {
      (**(code **)(**(long **)this + 8))();
    }
    *(undefined8 *)this = 0;
    return (unique_ptr<booster::locale::impl_icu::formatter<char>,_std::default_delete<booster::locale::impl_icu::formatter<char>_>_>
            )this;
  case 8:
    pnVar9 = (number_format<char> *)operator_new(0x40);
    pNVar10 = icu_formatters_cache::number_format(this_01,fmt_spell);
    paVar21 = &local_130.field_2;
    pcVar1 = (encoding->_M_dataplus)._M_p;
    local_130._M_dataplus._M_p = (pointer)paVar21;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_130,pcVar1,pcVar1 + encoding->_M_string_length);
    number_format<char>::number_format(pnVar9,pNVar10,&local_130);
    *(number_format<char> **)this = pnVar9;
    _Var17._M_p = local_130._M_dataplus._M_p;
    break;
  case 9:
    pnVar9 = (number_format<char> *)operator_new(0x40);
    pNVar10 = icu_formatters_cache::number_format(this_01,fmt_ord);
    paVar21 = &local_150.field_2;
    pcVar1 = (encoding->_M_dataplus)._M_p;
    local_150._M_dataplus._M_p = (pointer)paVar21;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_150,pcVar1,pcVar1 + encoding->_M_string_length);
    number_format<char>::number_format(pnVar9,pNVar10,&local_150);
    *(number_format<char> **)this = pnVar9;
    _Var17._M_p = local_150._M_dataplus._M_p;
    break;
  default:
    goto switchD_001832a0_default;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)_Var17._M_p != paVar21) {
    operator_delete(_Var17._M_p);
  }
switchD_001832a0_default:
  return (__uniq_ptr_data<booster::locale::impl_icu::formatter<char>,_std::default_delete<booster::locale::impl_icu::formatter<char>_>,_true,_true>
          )(__uniq_ptr_data<booster::locale::impl_icu::formatter<char>,_std::default_delete<booster::locale::impl_icu::formatter<char>_>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<formatter<CharType> > generate_formatter(
                    std::ios_base &ios,
                    icu::Locale const &locale,
                    std::string const &encoding)
        {
            using namespace booster::locale::flags;

            std::unique_ptr<formatter<CharType> > fmt;
            ios_info &info=ios_info::get(ios);
            uint64_t disp = info.display_flags();

            icu_formatters_cache const &cache = std::use_facet<icu_formatters_cache>(ios.getloc());


            if(disp == posix)
                return fmt;
           
            UErrorCode err=U_ZERO_ERROR;
            
            switch(disp) {
            case number:
                {
                    std::ios_base::fmtflags how = (ios.flags() & std::ios_base::floatfield);
                    icu::NumberFormat *nf = 0;

                    if(how == std::ios_base::scientific)
                        nf = cache.number_format(icu_formatters_cache::fmt_sci);
                    else
                        nf = cache.number_format(icu_formatters_cache::fmt_number);
                    
                    nf->setMaximumFractionDigits(ios.precision());
                    if(how == std::ios_base::scientific || how == std::ios_base::fixed ) {
                        nf->setMinimumFractionDigits(ios.precision());
                    }
                    else {
                        nf->setMinimumFractionDigits(0);
                    }
                    fmt.reset(new number_format<CharType>(nf,encoding));
                }
                break;
            case currency:
                {
                    icu::NumberFormat *nf;
                    
                    uint64_t curr = info.currency_flags();

                    if(curr == currency_default || curr == currency_national)
                        nf = cache.number_format(icu_formatters_cache::fmt_curr_nat);
                    else
                        nf = cache.number_format(icu_formatters_cache::fmt_curr_iso);

                    fmt.reset(new number_format<CharType>(nf,encoding));
                }
                break;
            case percent:
                {
                    icu::NumberFormat *nf = cache.number_format(icu_formatters_cache::fmt_per);
                    nf->setMaximumFractionDigits(ios.precision());
                    std::ios_base::fmtflags how = (ios.flags() & std::ios_base::floatfield);
                    if(how == std::ios_base::scientific || how == std::ios_base::fixed ) {
                        nf->setMinimumFractionDigits(ios.precision());
                    }
                    else {
                        nf->setMinimumFractionDigits(0);
                    }
                    fmt.reset(new number_format<CharType>(nf,encoding));
                    
                }
                break;
            case spellout:
                fmt.reset(new number_format<CharType>(cache.number_format(icu_formatters_cache::fmt_spell),encoding));
                break;
            case ordinal:
                fmt.reset(new number_format<CharType>(cache.number_format(icu_formatters_cache::fmt_ord),encoding));
                break;
            case date:
            case time:
            case datetime:
            case strftime:
                {
                    using namespace flags;
                    std::unique_ptr<icu::DateFormat> adf;
                    icu::DateFormat *df = 0;
                    icu::SimpleDateFormat *sdf = cache.date_formatter();
                    // try to use cached first
                    if(sdf) {
                        int tmf=info.time_flags();
                        switch(tmf) {
                        case time_short:
                            tmf=0;
                            break;
                        case time_long:
                            tmf=2;
                            break;
                        case time_full:
                            tmf=3;
                            break;
                        case time_default:
                        case time_medium:
                        default:
                            tmf=1;
                        }
                        int dtf=info.date_flags();
                        switch(dtf) {
                        case date_short:
                            dtf=0;
                            break;
                        case date_long:
                            dtf=2;
                            break;
                        case date_full:
                            dtf=3;
                            break;
                        case date_default:
                        case date_medium:
                        default:
                            dtf=1;
                        }

                        icu::UnicodeString pattern;
                        switch(disp) {
                        case date:
                            pattern = cache.date_format_[dtf];
                            break;
                        case time:
                            pattern = cache.time_format_[tmf];
                            break;
                        case datetime:
                            pattern = cache.date_time_format_[dtf][tmf];
                            break;
                        case strftime:
                            {
                                if( !cache.date_format_[1].isEmpty() 
                                    && !cache.time_format_[1].isEmpty()
                                    && !cache.date_time_format_[1][1].isEmpty())
                                {
                                    icu_std_converter<CharType> cvt_(encoding);
                                    std::basic_string<CharType> const &f=info.date_time_pattern<CharType>();
                                    pattern = strftime_to_icu(cvt_.icu(f.c_str(),f.c_str()+f.size()),locale);
                                }
                            }
                            break;
                        }
                        if(!pattern.isEmpty()) {
                            sdf->applyPattern(pattern);
                            df = sdf;
                            sdf = 0;
                        }
                        sdf = 0;
                    }
                    
                    if(!df) {
                        icu::DateFormat::EStyle dstyle = icu::DateFormat::kDefault;
                        icu::DateFormat::EStyle tstyle = icu::DateFormat::kDefault;
                        
                        switch(info.time_flags()) {
                        case time_short:    tstyle=icu::DateFormat::kShort; break;
                        case time_medium:   tstyle=icu::DateFormat::kMedium; break;
                        case time_long:     tstyle=icu::DateFormat::kLong; break;
                        case time_full:     tstyle=icu::DateFormat::kFull; break;
                        }
                        switch(info.date_flags()) {
                        case date_short:    dstyle=icu::DateFormat::kShort; break;
                        case date_medium:   dstyle=icu::DateFormat::kMedium; break;
                        case date_long:     dstyle=icu::DateFormat::kLong; break;
                        case date_full:     dstyle=icu::DateFormat::kFull; break;
                        }
                        
                        if(disp==date)
                            adf.reset(icu::DateFormat::createDateInstance(dstyle,locale));
                        else if(disp==time)
                            adf.reset(icu::DateFormat::createTimeInstance(tstyle,locale));
                        else if(disp==datetime)
                            adf.reset(icu::DateFormat::createDateTimeInstance(dstyle,tstyle,locale));
                        else {// strftime
                            icu_std_converter<CharType> cvt_(encoding);
                            std::basic_string<CharType> const &f=info.date_time_pattern<CharType>();
                            icu::UnicodeString fmt = strftime_to_icu(cvt_.icu(f.data(),f.data()+f.size()),locale);
                            adf.reset(new icu::SimpleDateFormat(fmt,locale,err));
                        }
                        if(U_FAILURE(err)) 
                            return fmt;
                        df = adf.get();
                    }

                    df->adoptTimeZone(get_time_zone(info.time_zone()));
                        
                    // Depending if we own formatter or not
                    if(adf.get())
                        fmt.reset(new date_format<CharType>(std::move(adf),encoding));
                    else
                        fmt.reset(new date_format<CharType>(std::move(df),encoding));
                }
                break;
            }

            return fmt;
        }